

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

void dictRelease(dict *ht)

{
  dictEntry *pdVar1;
  dictType *pdVar2;
  dictEntry **__ptr;
  dictEntry *__ptr_00;
  unsigned_long i;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 < ht->size; uVar3 = uVar3 + 1) {
    __ptr = ht->table;
    if (ht->used == 0) goto LAB_00104b36;
    __ptr_00 = __ptr[uVar3];
    if (__ptr[uVar3] != (dictEntry *)0x0) {
      while (__ptr_00 != (dictEntry *)0x0) {
        pdVar1 = __ptr_00->next;
        pdVar2 = ht->type;
        if (pdVar2->keyDestructor != (_func_void_void_ptr_void_ptr *)0x0) {
          (*pdVar2->keyDestructor)(ht->privdata,__ptr_00->key);
          pdVar2 = ht->type;
        }
        if (pdVar2->valDestructor != (_func_void_void_ptr_void_ptr *)0x0) {
          (*pdVar2->valDestructor)(ht->privdata,__ptr_00->val);
        }
        free(__ptr_00);
        ht->used = ht->used - 1;
        __ptr_00 = pdVar1;
      }
    }
  }
  __ptr = ht->table;
LAB_00104b36:
  free(__ptr);
  free(ht);
  return;
}

Assistant:

static void dictRelease(dict *ht) {
    _dictClear(ht);
    free(ht);
}